

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

Array<asl::String> * __thiscall asl::Array<asl::String>::resize(Array<asl::String> *this,int m)

{
  int iVar1;
  
  iVar1 = *(int *)&this->_a[-1].field_2;
  reserve(this,m);
  if (iVar1 < m) {
    asl_construct<asl::String>(this->_a + iVar1,m - iVar1);
  }
  else if (m < iVar1) {
    asl_destroy<asl::String>(this->_a + m,iVar1 - m);
  }
  *(int *)&this->_a[-1].field_2 = m;
  return this;
}

Assistant:

Array& resize(int m)
	{
		int n = d().n;
		reserve(m);
		if (m > n)
			asl_construct(_a + n, m - n);
		else if (m < n)
			asl_destroy(_a + m, n - m);
		d().n = m;
		return *this;
	}